

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O0

void __thiscall Server::handThisConn(Server *this)

{
  EventLoop *this_00;
  shared_ptr<Channel> local_20;
  Server *local_10;
  Server *this_local;
  
  this_00 = this->loop_;
  local_10 = this;
  std::shared_ptr<Channel>::shared_ptr(&local_20,&this->acceptChannel_);
  EventLoop::updatePoller(this_00,&local_20,0);
  std::shared_ptr<Channel>::~shared_ptr(&local_20);
  return;
}

Assistant:

void handThisConn() { loop_->updatePoller(acceptChannel_); }